

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O3

void __thiscall hgdb::json::VarStmt::~VarStmt(VarStmt *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Scope<hgdb::json::VarStmt>).super_ScopeBase._vptr_ScopeBase =
       (_func_int **)&PTR_serialize_002b1810;
  std::__detail::__variant::_Variant_storage<false,_hgdb::json::Variable,_unsigned_long>::
  ~_Variant_storage((_Variant_storage<false,_hgdb::json::Variable,_unsigned_long> *)&this->var_);
  (this->super_Scope<hgdb::json::VarStmt>).super_ScopeBase._vptr_ScopeBase =
       (_func_int **)&PTR_serialize_002b1880;
  pcVar2 = (this->super_Scope<hgdb::json::VarStmt>).condition._M_dataplus._M_p;
  paVar1 = &(this->super_Scope<hgdb::json::VarStmt>).condition.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_Scope<hgdb::json::VarStmt>).filename._M_dataplus._M_p;
  paVar1 = &(this->super_Scope<hgdb::json::VarStmt>).filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_Scope<hgdb::json::VarStmt>).super_ScopeBase._vptr_ScopeBase =
       (_func_int **)&PTR___cxa_pure_virtual_002b1480;
  std::
  vector<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>
  ::~vector(&(this->super_Scope<hgdb::json::VarStmt>).super_ScopeBase.scopes_);
  operator_delete(this,0xe8);
  return;
}

Assistant:

VarStmt(Variable var, uint64_t line, bool is_decl)
        : Scope<VarStmt>(line), var_(std::move(var)), is_decl_(is_decl) {}